

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void R_DrawPSprite(DPSprite *pspr,AActor *owner,float bobx,float boby,double wx,double wy,
                  double ticfrac)

{
  visstyle_t *pvVar1;
  vissprite_t *vis;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ushort uVar6;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  AInventory *pAVar7;
  lighttable_t *plVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  vispsp_t *pvVar11;
  vissprite_t *pvVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  PalEntry fade;
  int iVar16;
  AWeapon *pAVar17;
  FDynamicColormap *pFVar18;
  short sVar19;
  long lVar20;
  short sVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade_00;
  DObject *p;
  FTexture *pFVar26;
  lighttable_t *oldcolormap;
  BYTE *pBVar27;
  undefined1 auVar28 [16];
  double dVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  int iVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  FRenderStyle style;
  FRenderStyle local_34;
  
  if (R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis == '\0') {
    R_DrawPSprite();
  }
  if (R_DrawPSprite::avis.Count < vispspindex + 1) {
    uVar25 = (R_DrawPSprite::avis.Count - vispspindex) + 1;
    TArray<vissprite_t,_vissprite_t>::Grow(&R_DrawPSprite::avis,uVar25);
    R_DrawPSprite::avis.Count = R_DrawPSprite::avis.Count + uVar25;
  }
  uVar25 = pspr->Sprite;
  if (sprites.Count <= uVar25) {
    DPrintf(1,"R_DrawPSprite: invalid sprite number %i\n");
    return;
  }
  if ((int)(uint)sprites.Array[(int)uVar25].numframes <= pspr->Frame) {
    DPrintf(1,"R_DrawPSprite: invalid sprite frame %i : %i\n");
    return;
  }
  lVar20 = (long)pspr->Frame + (ulong)sprites.Array[(int)uVar25].spriteframes;
  uVar24 = (ulong)SpriteFrames.Array[lVar20].Texture[0].texnum;
  if (uVar24 < TexMan.Textures.Count) {
    pFVar26 = TexMan.Textures.Array[TexMan.Translation.Array[uVar24]].Texture;
  }
  else {
    pFVar26 = (FTexture *)0x0;
  }
  if (pFVar26->UseType == '\r') {
    return;
  }
  uVar6 = SpriteFrames.Array[lVar20].Flip;
  if (pspr->firstTic == false) {
    dVar4 = pspr->x;
    dVar5 = pspr->y;
    uVar30 = *(undefined4 *)&pspr->oldx;
    uVar31 = *(undefined4 *)((long)&pspr->oldx + 4);
    uVar33 = *(undefined4 *)&pspr->oldy;
    uVar34 = *(undefined4 *)((long)&pspr->oldy + 4);
  }
  else {
    pspr->firstTic = false;
    dVar4 = pspr->x;
    dVar5 = pspr->y;
    pspr->oldx = dVar4;
    pspr->oldy = dVar5;
    uVar30 = SUB84(dVar4,0);
    uVar31 = (undefined4)((ulong)dVar4 >> 0x20);
    uVar33 = SUB84(dVar5,0);
    uVar34 = (undefined4)((ulong)dVar5 >> 0x20);
  }
  pvVar12 = R_DrawPSprite::avis.Array;
  iVar32 = -(uint)((pspr->Flags & 2U) == 0);
  auVar28._4_4_ = iVar32;
  auVar28._0_4_ = iVar32;
  auVar28._8_4_ = iVar32;
  auVar28._12_4_ = iVar32;
  auVar9._8_8_ = (double)boby;
  auVar9._0_8_ = (double)bobx;
  dVar4 = SUB168(~auVar28 & auVar9,0) +
          ticfrac * (dVar4 - (double)CONCAT44(uVar31,uVar30)) + (double)CONCAT44(uVar31,uVar30);
  dVar5 = SUB168(~auVar28 & auVar9,8) +
          ticfrac * (dVar5 - (double)CONCAT44(uVar34,uVar33)) + (double)CONCAT44(uVar34,uVar33);
  if (((pspr->Flags & 1U) != 0) && (pspr->ID != 1)) {
    dVar4 = dVar4 + wx;
    dVar5 = dVar5 + wy;
  }
  dVar3 = (pFVar26->Scale).X;
  uVar25 = (uint)((double)(pFVar26->LeftOffset * 2) / dVar3);
  dVar29 = (dVar4 + -160.0) - (double)(int)((uVar25 & 1) + ((int)uVar25 >> 1));
  dVar4 = dVar29 * pspritexscale + CenterX + 6755399441055744.0;
  iVar32 = SUB84(dVar4,0);
  if (viewwidth < iVar32) {
    return;
  }
  uVar25 = (uint)((double)((uint)pFVar26->Width * 2) / dVar3);
  dVar3 = CenterX + 6755399441055744.0 +
          (dVar29 + (double)(int)((uVar25 & 1) + ((int)uVar25 >> 1))) * pspritexscale;
  iVar16 = SUB84(dVar3,0);
  if (iVar16 < 1) {
    return;
  }
  uVar24 = (ulong)vispspindex;
  vis = R_DrawPSprite::avis.Array + uVar24;
  R_DrawPSprite::avis.Array[uVar24].renderflags = (short)(owner->renderflags).Value;
  pvVar12[uVar24].floorclip = 0.0;
  pvVar12[uVar24].field_14.field_0.texturemid =
       (double)(int)pFVar26->TopOffset + (100.0 - dVar5) * (pFVar26->Scale).Y;
  if ((camera->player != (player_t *)0x0) &&
     ((((DFrameBuffer *)RenderTarget != screen || (viewheight == RenderTarget->Height)) ||
      ((0x140 < RenderTarget->Width && (st_scale.Value == false)))))) {
    p = (pspr->Caller).field_0.o;
    if (p == (DObject *)0x0) {
LAB_0031ae3c:
      p = (DObject *)0x0;
    }
    else if ((p->ObjectFlags & 0x20) != 0) {
      (pspr->Caller).field_0.p = (AActor *)0x0;
      goto LAB_0031ae3c;
    }
    pAVar17 = dyn_cast<AWeapon>(p);
    if ((pAVar17 != (AWeapon *)0x0) && (fVar2 = pAVar17->YAdjust, fVar2 != 0.0)) {
      if (((DFrameBuffer *)RenderTarget == screen) && (viewheight != RenderTarget->Height)) {
        dVar5 = (double)fVar2 * StatusBar->Displacement;
      }
      else {
        dVar5 = (double)fVar2;
      }
      (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar5;
    }
  }
  if (pspr->ID < 0x7ffffffd) {
    (vis->field_14).field_0.texturemid =
         (vis->field_14).field_0.texturemid - (double)BaseRatioSizes[WidescreenRatio][2];
  }
  iVar14 = 0;
  sVar19 = 0;
  if (0 < iVar32) {
    sVar19 = SUB82(dVar4,0);
  }
  vis->x1 = sVar19;
  sVar21 = (short)viewwidth;
  if (iVar16 < viewwidth) {
    sVar21 = SUB82(dVar3,0);
  }
  vis->x2 = sVar21;
  vis->xscale = SUB84(pspritexscale / (pFVar26->Scale).X + 103079215104.0,0);
  vis->yscale = (float)(pspriteyscale / (pFVar26->Scale).Y);
  vis->Translation = 0;
  (vis->field_13).pic = pFVar26;
  vis->ColormapNum = '\0';
  iVar16 = SUB84((pFVar26->Scale).X * pspritexiscale + 103079215104.0,0);
  if ((uVar6 & 1) == 0) {
    (vis->field_14).field_0.xiscale = iVar16;
  }
  else {
    iVar16 = -iVar16;
    (vis->field_14).field_0.xiscale = iVar16;
    iVar14 = *(int *)&pFVar26->Width * 0x10000 + -1;
  }
  iVar22 = 0;
  if (iVar32 < sVar19) {
    iVar22 = (sVar19 - iVar32) * iVar16;
  }
  (vis->field_14).field_0.startfrac = iVar22 + iVar14;
  pFVar18 = basecolormap;
  if (pspr->ID < 0x7ffffffd) {
    (vis->Style).Alpha = (float)owner->Alpha;
    uVar25 = (owner->RenderStyle).AsDWORD;
    uVar23 = uVar25 >> 0x18 & 0x20;
    uVar15 = uVar23 >> 5 ^ 1;
    if ((uVar25 >> 0x1c & 1) == 0) {
      uVar15 = uVar23;
    }
    (vis->Style).RenderStyle.AsDWORD = uVar25;
    pFVar18 = basecolormap;
    if ((uVar25 >> 0x1e & 1) != 0) {
      fade_00.d = 0xffffff;
      if (uVar15 == 0) {
        fade_00.d = 0;
      }
      pFVar18 = GetSpecialLights((PalEntry)(basecolormap->Color).field_0.field_0,(PalEntry)fade_00,
                                 basecolormap->Desaturate);
      uVar15 = 0;
    }
    pvVar1 = &vis->Style;
    if (realfixedcolormap == (FSpecialColormap *)0x0) {
      if (uVar15 != 0) {
        color = (pFVar18->Color).field_0.field_0;
        fade = PalEntry::InverseColor(&pFVar18->Fade);
        pFVar18 = GetSpecialLights((PalEntry)color,fade,pFVar18->Desaturate);
      }
      uVar24 = (ulong)fixedlightlev;
      if ((long)uVar24 < 0) {
        if ((foggy == false) && ((pspr->State->field_0x22 & 1) != 0)) {
          pBVar27 = pFVar18->Maps;
          goto LAB_0031b174;
        }
        iVar16 = 0x1f;
        if (spriteshade._2_2_ < 0x1f) {
          iVar16 = (int)spriteshade._2_2_;
        }
        iVar14 = 0;
        if (0 < iVar16) {
          iVar14 = iVar16;
        }
        uVar24 = (ulong)(uint)(iVar14 << 8);
      }
      pBVar27 = pFVar18->Maps + uVar24;
    }
    else {
      pBVar27 = realfixedcolormap->Colormap;
    }
LAB_0031b174:
    pvVar1->colormap = pBVar27;
    pAVar7 = (camera->Inventory).field_0.p;
    if (pAVar7 == (AInventory *)0x0) {
LAB_0031b200:
      bVar13 = false;
    }
    else {
      if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
        (camera->Inventory).field_0.p = (AInventory *)0x0;
        goto LAB_0031b200;
      }
      (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3f])(pAVar7,pvVar1);
      plVar8 = pvVar1->colormap;
      if (plVar8 == pBVar27) {
        bVar13 = false;
      }
      else {
        bVar13 = true;
        if (((SpecialColormaps.Array)->Colormap <= plVar8) &&
           (plVar8 <= SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap)) {
          bVar13 = pFVar18->Maps + 0x2000 <= plVar8 || plVar8 < pFVar18->Maps;
        }
      }
    }
    bVar10 = bVar13;
    if (((r_shadercolormaps.Value == false) &&
        ((SpecialColormaps.Array)->Colormap <= pvVar1->colormap)) &&
       (bVar10 = true,
       SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap < pvVar1->colormap)) {
      bVar10 = bVar13;
    }
    bVar13 = true;
    if (NormalLight.Maps == realcolormaps) {
      bVar13 = bVar10;
    }
    if (pFVar18 == &NormalLight) {
      bVar10 = bVar13;
    }
    if ((((!bVar10) && (realfixedcolormap == (FSpecialColormap *)0x0)) &&
        ((pFVar18 == &NormalLight &&
         (((NormalLightHasFixedLights & 1U) != 0 &&
          (iVar16 = (*((vis->field_13).pic)->_vptr_FTexture[5])(), pFVar18 = &NormalLight,
          bVar10 = bVar13, (char)iVar16 != '\0')))))) || (bVar10)) goto LAB_0031b2b6;
  }
  else {
    (vis->Style).colormap = basecolormap->Maps;
    (vis->Style).RenderStyle = LegacyRenderStyles[1];
  }
  if (((DFrameBuffer *)RenderTarget == screen) && (screen->Accel2D != false)) {
    local_34 = (FRenderStyle)*(FRenderStyle *)&(vis->Style).RenderStyle.field_0;
    FRenderStyle::CheckFuzz(&local_34);
    if (local_34.field_0.BlendOp != '\x04') {
      if (vispsprites.Count < vispspindex + 1) {
        uVar25 = (vispsprites.Count - vispspindex) + 1;
        TArray<vispsp_t,_vispsp_t>::Grow(&vispsprites,uVar25);
        vispsprites.Count = vispsprites.Count + uVar25;
      }
      pvVar11 = vispsprites.Array;
      uVar24 = (ulong)vispspindex;
      vispsprites.Array[uVar24].vis = vis;
      pvVar11[uVar24].basecolormap = pFVar18;
      pvVar11[uVar24].x1 = iVar32;
      vispspindex = vispspindex + 1;
      return;
    }
  }
LAB_0031b2b6:
  R_DrawVisSprite(vis);
  return;
}

Assistant:

void R_DrawPSprite(DPSprite *pspr, AActor *owner, float bobx, float boby, double wx, double wy, double ticfrac)
{
	double 				tx;
	int 				x1;
	int 				x2;
	double				sx, sy;
	spritedef_t*		sprdef;
	spriteframe_t*		sprframe;
	FTextureID			picnum;
	WORD				flip;
	FTexture*			tex;
	vissprite_t*		vis;
	bool				noaccel;
	static TArray<vissprite_t> avis;

	if (avis.Size() < vispspindex + 1)
		avis.Reserve(avis.Size() - vispspindex + 1);

	// decide which patch to use
	if ((unsigned)pspr->GetSprite() >= (unsigned)sprites.Size())
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite number %i\n", pspr->GetSprite());
		return;
	}
	sprdef = &sprites[pspr->GetSprite()];
	if (pspr->GetFrame() >= sprdef->numframes)
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite frame %i : %i\n", pspr->GetSprite(), pspr->GetFrame());
		return;
	}
	sprframe = &SpriteFrames[sprdef->spriteframes + pspr->GetFrame()];

	picnum = sprframe->Texture[0];
	flip = sprframe->Flip & 1;
	tex = TexMan(picnum);

	if (tex->UseType == FTexture::TEX_Null)
		return;

	if (pspr->firstTic)
	{ // Can't interpolate the first tic.
		pspr->firstTic = false;
		pspr->oldx = pspr->x;
		pspr->oldy = pspr->y;
	}

	sx = pspr->oldx + (pspr->x - pspr->oldx) * ticfrac;
	sy = pspr->oldy + (pspr->y - pspr->oldy) * ticfrac;

	if (pspr->Flags & PSPF_ADDBOB)
	{
		sx += bobx;
		sy += boby;
	}

	if (pspr->Flags & PSPF_ADDWEAPON && pspr->GetID() != PSP_WEAPON)
	{
		sx += wx;
		sy += wy;
	}

	// calculate edges of the shape
	tx = sx - BASEXCENTER;

	tx -= tex->GetScaledLeftOffset();
	x1 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the right side
	if (x1 > viewwidth)
		return;

	tx += tex->GetScaledWidth();
	x2 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the left side
	if (x2 <= 0)
		return;

	// store information in a vissprite
	vis = &avis[vispspindex];
	vis->renderflags = owner->renderflags;
	vis->floorclip = 0;

	vis->texturemid = (BASEYCENTER - sy) * tex->Scale.Y + tex->TopOffset;

	if (camera->player && (RenderTarget != screen ||
		viewheight == RenderTarget->GetHeight() ||
		(RenderTarget->GetWidth() > (BASEXCENTER * 2) && !st_scale)))
	{	// Adjust PSprite for fullscreen views
		AWeapon *weapon = dyn_cast<AWeapon>(pspr->GetCaller());
		if (weapon != nullptr && weapon->YAdjust != 0)
		{
			if (RenderTarget != screen || viewheight == RenderTarget->GetHeight())
			{
				vis->texturemid -= weapon->YAdjust;
			}
			else
			{
				vis->texturemid -= StatusBar->GetDisplacement() * weapon->YAdjust;
			}
		}
	}
	if (pspr->GetID() < PSP_TARGETCENTER)
	{ // Move the weapon down for 1280x1024.
		vis->texturemid -= BaseRatioSizes[WidescreenRatio][2];
	}
	vis->x1 = x1 < 0 ? 0 : x1;
	vis->x2 = x2 >= viewwidth ? viewwidth : x2;
	vis->xscale = FLOAT2FIXED(pspritexscale / tex->Scale.X);
	vis->yscale = float(pspriteyscale / tex->Scale.Y);
	vis->Translation = 0;		// [RH] Use default colors
	vis->pic = tex;
	vis->ColormapNum = 0;

	if (flip)
	{
		vis->xiscale = -FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = (tex->GetWidth() << FRACBITS) - 1;
	}
	else
	{
		vis->xiscale = FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = 0;
	}

	if (vis->x1 > x1)
		vis->startfrac += vis->xiscale*(vis->x1 - x1);

	noaccel = false;
	FDynamicColormap *colormap_to_use = nullptr;
	if (pspr->GetID() < PSP_TARGETCENTER)
	{
		vis->Style.Alpha = float(owner->Alpha);
		vis->Style.RenderStyle = owner->RenderStyle;

		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertcolormap = (vis->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

		if (vis->Style.RenderStyle.Flags & STYLEF_InvertSource)
		{
			invertcolormap = !invertcolormap;
		}

		FDynamicColormap *mybasecolormap = basecolormap;

		if (vis->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
		{
			if (invertcolormap)
			{ // Fade to white
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255, 255, 255), mybasecolormap->Desaturate);
				invertcolormap = false;
			}
			else
			{ // Fade to black
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0, 0, 0), mybasecolormap->Desaturate);
			}
		}

		if (realfixedcolormap != nullptr)
		{ // fixed color
			vis->Style.colormap = realfixedcolormap->Colormap;
		}
		else
		{
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				vis->Style.colormap = mybasecolormap->Maps + fixedlightlev;
			}
			else if (!foggy && pspr->GetState()->GetFullbright())
			{ // full bright
				vis->Style.colormap = mybasecolormap->Maps;	// [RH] use basecolormap
			}
			else
			{ // local light
				vis->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(0, spriteshade) << COLORMAPSHIFT);
			}
		}
		if (camera->Inventory != nullptr)
		{
			lighttable_t *oldcolormap = vis->Style.colormap;
			camera->Inventory->AlterWeaponSprite(&vis->Style);
			if (vis->Style.colormap != oldcolormap)
			{
				// The colormap has changed. Is it one we can easily identify?
				// If not, then don't bother trying to identify it for
				// hardware accelerated drawing.
				if (vis->Style.colormap < SpecialColormaps[0].Colormap ||
					vis->Style.colormap > SpecialColormaps.Last().Colormap)
				{
					noaccel = true;
				}
				// Has the basecolormap changed? If so, we can't hardware accelerate it,
				// since we don't know what it is anymore.
				else if (vis->Style.colormap < mybasecolormap->Maps ||
					vis->Style.colormap >= mybasecolormap->Maps + NUMCOLORMAPS * 256)
				{
					noaccel = true;
				}
			}
		}
		// If we're drawing with a special colormap, but shaders for them are disabled, do
		// not accelerate.
		if (!r_shadercolormaps && (vis->Style.colormap >= SpecialColormaps[0].Colormap &&
			vis->Style.colormap <= SpecialColormaps.Last().Colormap))
		{
			noaccel = true;
		}
		// If drawing with a BOOM colormap, disable acceleration.
		if (mybasecolormap == &NormalLight && NormalLight.Maps != realcolormaps)
		{
			noaccel = true;
		}
		// If the main colormap has fixed lights, and this sprite is being drawn with that
		// colormap, disable acceleration so that the lights can remain fixed.
		if (!noaccel && realfixedcolormap == nullptr &&
			NormalLightHasFixedLights && mybasecolormap == &NormalLight &&
			vis->pic->UseBasePalette())
		{
			noaccel = true;
		}
		colormap_to_use = mybasecolormap;
	}
	else
	{
		colormap_to_use = basecolormap;
		vis->Style.colormap = basecolormap->Maps;
		vis->Style.RenderStyle = STYLE_Normal;
	}

	// Check for hardware-assisted 2D. If it's available, and this sprite is not
	// fuzzy, don't draw it until after the switch to 2D mode.
	if (!noaccel && RenderTarget == screen && (DFrameBuffer *)screen->Accel2D)
	{
		FRenderStyle style = vis->Style.RenderStyle;
		style.CheckFuzz();
		if (style.BlendOp != STYLEOP_Fuzz)
		{
			if (vispsprites.Size() < vispspindex + 1)
				vispsprites.Reserve(vispsprites.Size() - vispspindex + 1);

			vispsprites[vispspindex].vis = vis;
			vispsprites[vispspindex].basecolormap = colormap_to_use;
			vispsprites[vispspindex].x1 = x1;
			vispspindex++;
			return;
		}
	}
	R_DrawVisSprite(vis);
}